

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall Jupiter::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Data *pDVar1;
  size_type __len1;
  char *__name;
  ushort uVar2;
  addrinfo *__ai;
  uint uVar3;
  int iVar4;
  size_t __len2;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  ushort in_R8W;
  int iVar5;
  uint __len_00;
  addrinfo *paVar6;
  string __str;
  addrinfo *ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  addrinfo *local_38;
  
  uVar2 = (ushort)__addr;
  pDVar1 = this->m_data;
  __len1 = (pDVar1->remote_host)._M_string_length;
  __len2 = strlen((char *)CONCAT44(in_register_00000034,__fd));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&pDVar1->remote_host,0,__len1,(char *)CONCAT44(in_register_00000034,__fd),__len2);
  pDVar1 = this->m_data;
  pDVar1->remote_port = uVar2;
  __name = (pDVar1->remote_host)._M_dataplus._M_p;
  __len_00 = 1;
  if ((9 < uVar2) && (__len_00 = 2, 99 < uVar2)) {
    uVar3 = (uint)__addr & 0xffff;
    __len_00 = 3;
    if (999 < uVar3) {
      __len_00 = 5 - (uVar3 < 10000);
    }
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_58,(ulong)__len_00,'-');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_58._M_dataplus._M_p,__len_00,(uint)__addr);
  local_38 = (addrinfo *)0x0;
  getaddrinfo(__name,local_58._M_dataplus._M_p,(addrinfo *)0x0,&local_38);
  __ai = local_38;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (__ai == (addrinfo *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    paVar6 = __ai;
    do {
      if (CONCAT44(in_register_0000000c,__len) == 0) {
        iVar4 = socket(paVar6->ai_family,this->m_data->sockType,this->m_data->sockProto);
        this->m_data->rawSock = iVar4;
        if (iVar4 != -1) goto LAB_00137cbd;
      }
      else {
        iVar4 = bind(this,__len,(sockaddr *)(ulong)in_R8W,0);
        if ((char)iVar4 == '\0') goto LAB_00137cfc;
        iVar4 = this->m_data->rawSock;
LAB_00137cbd:
        iVar4 = ::connect(iVar4,paVar6->ai_addr,paVar6->ai_addrlen);
        if (iVar4 != -1) {
          iVar5 = 1;
          goto LAB_00137cfc;
        }
        ::close(this->m_data->rawSock);
        this->m_data->rawSock = -1;
      }
      paVar6 = paVar6->ai_next;
    } while (paVar6 != (addrinfo *)0x0);
    iVar5 = 0;
LAB_00137cfc:
    freeaddrinfo(__ai);
  }
  return iVar5;
}

Assistant:

bool Jupiter::Socket::connect(const char *hostname, unsigned short iPort, const char *clientAddress, unsigned short clientPort) {
#if defined _WIN32
	if (!socketInit && !Jupiter::Socket::init())
		return false;
#endif // _WIN32
	m_data->remote_host = hostname;
	m_data->remote_port = iPort;
	addrinfo *info_head = Jupiter::Socket::getAddrInfo(m_data->remote_host.c_str(), std::to_string(m_data->remote_port).c_str());
	if (info_head != nullptr) {
		addrinfo *info = info_head;
		do {
			if (clientAddress != nullptr) {
				// bind will initialize our socket
				if (Jupiter::Socket::bind(clientAddress, clientPort, false) == false)
					break;
			}
			else {
				m_data->rawSock = socket(info->ai_family, m_data->sockType, m_data->sockProto);
				if (m_data->rawSock == INVALID_SOCKET) {
					info = info->ai_next;
					continue;
				}
			}

			if (::connect(m_data->rawSock, info->ai_addr, info->ai_addrlen) == SOCKET_ERROR) {
#if defined _WIN32
				::closesocket(m_data->rawSock);
#else // _WIN32
				::close(m_data->rawSock);
#endif // WIN32
				m_data->rawSock = INVALID_SOCKET;
				info = info->ai_next;
				continue;
			}

			Jupiter::Socket::freeAddrInfo(info_head);
			return true;
		} while (info != nullptr);
		Jupiter::Socket::freeAddrInfo(info_head);
	}
	return false;
}